

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereUsablePartialIndex(int iTab,u8 jointype,WhereClause *pWC,Expr *pWhere)

{
  u8 uVar1;
  uint uVar2;
  Expr *pE1;
  int iVar3;
  int iVar4;
  Parse *pParse;
  WhereTerm *pWVar5;
  
  if ((jointype & 0x40) == 0) {
    pParse = pWC->pWInfo->pParse;
    uVar1 = pWhere->op;
    while (uVar1 == ',') {
      iVar3 = whereUsablePartialIndex(iTab,jointype,pWC,pWhere->pLeft);
      if (iVar3 == 0) {
        return 0;
      }
      pWhere = pWhere->pRight;
      uVar1 = pWhere->op;
    }
    if ((pParse->db->flags & 0x800000) != 0) {
      pParse = (Parse *)0x0;
    }
    if (0 < pWC->nTerm) {
      pWVar5 = pWC->a;
      iVar3 = 0;
      do {
        pE1 = pWVar5->pExpr;
        uVar2 = pE1->flags;
        if ((uVar2 & 1) == 0) {
          if (((jointype & 0x20) == 0) || ((uVar2 & 1) != 0)) goto LAB_001a62b7;
        }
        else if (((pE1->w).iJoin == iTab) && ((jointype & 0x20) == 0 || (uVar2 & 1) != 0)) {
LAB_001a62b7:
          iVar4 = sqlite3ExprImpliesExpr(pParse,pE1,pWhere,iTab);
          if ((iVar4 != 0) && ((pWVar5->wtFlags & 0x80) == 0)) {
            return 1;
          }
        }
        iVar3 = iVar3 + 1;
        pWVar5 = pWVar5 + 1;
      } while (iVar3 < pWC->nTerm);
    }
  }
  return 0;
}

Assistant:

static int whereUsablePartialIndex(
  int iTab,             /* The table for which we want an index */
  u8 jointype,          /* The JT_* flags on the join */
  WhereClause *pWC,     /* The WHERE clause of the query */
  Expr *pWhere          /* The WHERE clause from the partial index */
){
  int i;
  WhereTerm *pTerm;
  Parse *pParse;

  if( jointype & JT_LTORJ ) return 0;
  pParse = pWC->pWInfo->pParse;
  while( pWhere->op==TK_AND ){
    if( !whereUsablePartialIndex(iTab,jointype,pWC,pWhere->pLeft) ) return 0;
    pWhere = pWhere->pRight;
  }
  if( pParse->db->flags & SQLITE_EnableQPSG ) pParse = 0;
  for(i=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    Expr *pExpr;
    pExpr = pTerm->pExpr;
    if( (!ExprHasProperty(pExpr, EP_OuterON) || pExpr->w.iJoin==iTab)
     && ((jointype & JT_OUTER)==0 || ExprHasProperty(pExpr, EP_OuterON))
     && sqlite3ExprImpliesExpr(pParse, pExpr, pWhere, iTab)
     && (pTerm->wtFlags & TERM_VNULL)==0
    ){
      return 1;
    }
  }
  return 0;
}